

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# carLot.cpp
# Opt level: O1

void PrintInventory(vector<Car,_std::allocator<Car>_> *cars)

{
  pointer pCVar1;
  pointer pCVar2;
  char cVar3;
  long lVar4;
  ulong in_RAX;
  ostream *poVar5;
  long *plVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  char *pcVar10;
  int iStack_84;
  vector<Car,_std::allocator<Car>_> vStack_80;
  vector<Car,_std::allocator<Car>_> *pvStack_68;
  ostream *poStack_60;
  long lStack_58;
  char *pcStack_50;
  undefined8 uStack_48;
  code *pcStack_40;
  ulong local_38;
  
  pCVar1 = (cars->super__Vector_base<Car,_std::allocator<Car>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  pCVar2 = (cars->super__Vector_base<Car,_std::allocator<Car>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  pcStack_40 = (code *)0x103a82;
  local_38 = in_RAX;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  pcStack_40 = (code *)0x103a8d;
  std::ostream::put(-0x60);
  pcStack_40 = (code *)0x103a95;
  poVar5 = (ostream *)std::ostream::flush();
  cVar3 = (char)poVar5;
  if (pCVar1 == pCVar2) {
    pcStack_40 = (code *)0x104258;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"No cars in inventory!",0x15);
    pcStack_40 = (code *)0x10426c;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + cVar3);
    pcStack_40 = (code *)0x104277;
    std::ostream::put(cVar3);
    pcStack_40 = (code *)0x10427f;
    plVar6 = (long *)std::ostream::flush();
    pcStack_40 = (code *)0x104296;
    std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
    pcStack_40 = (code *)0x1042a1;
    std::ostream::put((char)plVar6);
    std::ostream::flush();
    return;
  }
  pcStack_40 = (code *)0x103ab5;
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + cVar3);
  pcStack_40 = (code *)0x103ac0;
  std::ostream::put(cVar3);
  pcStack_40 = (code *)0x103ac8;
  std::ostream::flush();
  pcStack_40 = (code *)0x103adc;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Inventory printout:",0x13);
  pcStack_40 = (code *)0x103af0;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  pcStack_40 = (code *)0x103afb;
  std::ostream::put(-0x60);
  pcStack_40 = (code *)0x103b03;
  plVar6 = (long *)std::ostream::flush();
  pcStack_40 = (code *)0x103b1a;
  std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
  pcStack_40 = (code *)0x103b25;
  std::ostream::put((char)plVar6);
  pcStack_40 = (code *)0x103b2d;
  std::ostream::flush();
  if ((cars->super__Vector_base<Car,_std::allocator<Car>_>)._M_impl.super__Vector_impl_data.
      _M_finish !=
      (cars->super__Vector_base<Car,_std::allocator<Car>_>)._M_impl.super__Vector_impl_data._M_start
     ) {
    lVar9 = 0;
    uVar8 = 0;
    do {
      pcVar10 = (char *)&std::cout;
      pcStack_40 = (code *)0x103b5d;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Car ",4);
      local_38 = uVar8 + 1;
      pcStack_40 = (code *)0x103b6d;
      plVar6 = (long *)std::ostream::operator<<((ostream *)&std::cout,(int)local_38);
      pcStack_40 = (code *)0x103b84;
      std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
      pcStack_40 = (code *)0x103b8f;
      std::ostream::put((char)plVar6);
      pcStack_40 = (code *)0x103b97;
      poVar5 = (ostream *)std::ostream::flush();
      pcStack_40 = (code *)0x103bae;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      pcStack_40 = (code *)0x103bb9;
      std::ostream::put((char)poVar5);
      pcStack_40 = (code *)0x103bc1;
      std::ostream::flush();
      pcStack_40 = (code *)0x103bd5;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Make: ",6);
      pCVar1 = (cars->super__Vector_base<Car,_std::allocator<Car>_>)._M_impl.super__Vector_impl_data
               ._M_start;
      uVar7 = ((long)(cars->super__Vector_base<Car,_std::allocator<Car>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pCVar1 >> 3) * -0x1111111111111111;
      if (uVar7 < uVar8 || uVar7 - uVar8 == 0) {
LAB_001042b7:
        pcStack_40 = main;
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar8
                  );
        uStack_48 = 0xeeeeeeeeeeeeeeef;
        vStack_80.super__Vector_base<Car,_std::allocator<Car>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        vStack_80.super__Vector_base<Car,_std::allocator<Car>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        vStack_80.super__Vector_base<Car,_std::allocator<Car>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        pvStack_68 = cars;
        poStack_60 = poVar5;
        lStack_58 = lVar9;
        pcStack_50 = pcVar10;
        pcStack_40 = (code *)uVar8;
        do {
          iStack_84 = 0;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Welcome to the car inventory system!",0x24);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
          std::ostream::put(-0x60);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Please chose a number:",0x16);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
          std::ostream::put(-0x60);
          plVar6 = (long *)std::ostream::flush();
          std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
          std::ostream::put((char)plVar6);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"1) Add car",10);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
          std::ostream::put(-0x60);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"2) List inventory",0x11);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
          std::ostream::put(-0x60);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"3) Display profit",0x11);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
          std::ostream::put(-0x60);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"4) Quit",7);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
          std::ostream::put(-0x60);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Choice [1-4]: ",0xe);
          std::istream::operator>>((istream *)&std::cin,&iStack_84);
          switch(iStack_84) {
          case 1:
            AddCar(&vStack_80);
            break;
          case 2:
            PrintInventory(&vStack_80);
            break;
          case 3:
            CalculateProfit(&vStack_80);
            break;
          case 4:
            exit(0);
          }
        } while( true );
      }
      pcStack_40 = (code *)0x103c01;
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,
                          *(char **)((long)&(pCVar1->make)._M_dataplus._M_p + lVar9),
                          *(long *)((long)&(pCVar1->make)._M_string_length + lVar9));
      pcStack_40 = (code *)0x103c18;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      pcStack_40 = (code *)0x103c23;
      std::ostream::put((char)poVar5);
      pcStack_40 = (code *)0x103c2b;
      std::ostream::flush();
      pcStack_40 = (code *)0x103c3f;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Model: ",7);
      pCVar1 = (cars->super__Vector_base<Car,_std::allocator<Car>_>)._M_impl.super__Vector_impl_data
               ._M_start;
      uVar7 = ((long)(cars->super__Vector_base<Car,_std::allocator<Car>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pCVar1 >> 3) * -0x1111111111111111;
      if (uVar7 < uVar8 || uVar7 - uVar8 == 0) goto LAB_001042b7;
      pcStack_40 = (code *)0x103c6c;
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,
                          *(char **)((long)&(pCVar1->model)._M_dataplus._M_p + lVar9),
                          *(long *)((long)&(pCVar1->model)._M_string_length + lVar9));
      pcStack_40 = (code *)0x103c83;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      pcStack_40 = (code *)0x103c8e;
      std::ostream::put((char)poVar5);
      pcStack_40 = (code *)0x103c96;
      std::ostream::flush();
      pcStack_40 = (code *)0x103caa;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Year: ",6);
      pCVar1 = (cars->super__Vector_base<Car,_std::allocator<Car>_>)._M_impl.super__Vector_impl_data
               ._M_start;
      uVar7 = ((long)(cars->super__Vector_base<Car,_std::allocator<Car>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pCVar1 >> 3) * -0x1111111111111111;
      if (uVar7 < uVar8 || uVar7 - uVar8 == 0) goto LAB_001042b7;
      pcStack_40 = (code *)0x103cd2;
      poVar5 = (ostream *)
               std::ostream::operator<<((ostream *)&std::cout,*(int *)((long)&pCVar1->year + lVar9))
      ;
      pcStack_40 = (code *)0x103ce9;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      pcStack_40 = (code *)0x103cf4;
      std::ostream::put((char)poVar5);
      pcStack_40 = (code *)0x103cfc;
      std::ostream::flush();
      pcStack_40 = (code *)0x103d10;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Purchase price: $",0x11);
      lVar4 = std::cout;
      *(undefined8 *)(strtol + *(long *)(std::cout + -0x18)) = 2;
      *(uint *)(__cxa_rethrow + *(long *)(lVar4 + -0x18)) =
           *(uint *)(__cxa_rethrow + *(long *)(lVar4 + -0x18)) & 0xfffffefb | 4;
      pCVar1 = (cars->super__Vector_base<Car,_std::allocator<Car>_>)._M_impl.super__Vector_impl_data
               ._M_start;
      uVar7 = ((long)(cars->super__Vector_base<Car,_std::allocator<Car>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pCVar1 >> 3) * -0x1111111111111111;
      if (uVar7 < uVar8 || uVar7 - uVar8 == 0) goto LAB_001042b7;
      pcStack_40 = (code *)0x103d62;
      poVar5 = std::ostream::_M_insert<double>(*(double *)((long)&pCVar1->purchasePrice + lVar9));
      pcStack_40 = (code *)0x103d79;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      pcStack_40 = (code *)0x103d84;
      std::ostream::put((char)poVar5);
      pcStack_40 = (code *)0x103d8c;
      std::ostream::flush();
      pcStack_40 = (code *)0x103da0;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Date purchased: ",0x10);
      pCVar1 = (cars->super__Vector_base<Car,_std::allocator<Car>_>)._M_impl.super__Vector_impl_data
               ._M_start;
      uVar7 = ((long)(cars->super__Vector_base<Car,_std::allocator<Car>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pCVar1 >> 3) * -0x1111111111111111;
      if (uVar7 < uVar8 || uVar7 - uVar8 == 0) goto LAB_001042b7;
      pcStack_40 = (code *)0x103dc8;
      poVar5 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)&std::cout,
                          *(int *)((long)&(pCVar1->datePurchased).month + lVar9));
      pcVar10 = "/";
      pcStack_40 = (code *)0x103de2;
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"/",1);
      pCVar1 = (cars->super__Vector_base<Car,_std::allocator<Car>_>)._M_impl.super__Vector_impl_data
               ._M_start;
      uVar7 = ((long)(cars->super__Vector_base<Car,_std::allocator<Car>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pCVar1 >> 3) * -0x1111111111111111;
      if (uVar7 < uVar8 || uVar7 - uVar8 == 0) goto LAB_001042b7;
      pcStack_40 = (code *)0x103e0a;
      poVar5 = (ostream *)
               std::ostream::operator<<(poVar5,*(int *)((long)&(pCVar1->datePurchased).day + lVar9))
      ;
      pcStack_40 = (code *)0x103e1d;
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"/",1);
      pCVar1 = (cars->super__Vector_base<Car,_std::allocator<Car>_>)._M_impl.super__Vector_impl_data
               ._M_start;
      uVar7 = ((long)(cars->super__Vector_base<Car,_std::allocator<Car>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pCVar1 >> 3) * -0x1111111111111111;
      if (uVar7 < uVar8 || uVar7 - uVar8 == 0) goto LAB_001042b7;
      pcStack_40 = (code *)0x103e45;
      poVar5 = (ostream *)
               std::ostream::operator<<
                         (poVar5,*(int *)((long)&(pCVar1->datePurchased).year + lVar9));
      pcStack_40 = (code *)0x103e5c;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      pcStack_40 = (code *)0x103e67;
      std::ostream::put((char)poVar5);
      pcStack_40 = (code *)0x103e6f;
      std::ostream::flush();
      pCVar1 = (cars->super__Vector_base<Car,_std::allocator<Car>_>)._M_impl.super__Vector_impl_data
               ._M_start;
      uVar7 = ((long)(cars->super__Vector_base<Car,_std::allocator<Car>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pCVar1 >> 3) * -0x1111111111111111;
      pcVar10 = (char *)&std::cout;
      if (uVar7 < uVar8 || uVar7 - uVar8 == 0) goto LAB_001042b7;
      if ((&pCVar1->isSold)[lVar9] == true) {
        pcStack_40 = (code *)0x103eb1;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Status: SOLD",0xc)
        ;
        pcStack_40 = (code *)0x103ec5;
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
        pcStack_40 = (code *)0x103ed0;
        std::ostream::put(-0x60);
        pcStack_40 = (code *)0x103ed8;
        std::ostream::flush();
        pcStack_40 = (code *)0x103eec;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Sale Price: $",0xd);
        lVar4 = std::cout;
        *(undefined8 *)(strtol + *(long *)(std::cout + -0x18)) = 2;
        *(uint *)(__cxa_rethrow + *(long *)(lVar4 + -0x18)) =
             *(uint *)(__cxa_rethrow + *(long *)(lVar4 + -0x18)) & 0xfffffefb | 4;
        pCVar1 = (cars->super__Vector_base<Car,_std::allocator<Car>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar7 = ((long)(cars->super__Vector_base<Car,_std::allocator<Car>_>)._M_impl.
                       super__Vector_impl_data._M_finish - (long)pCVar1 >> 3) * -0x1111111111111111;
        if (uVar7 < uVar8 || uVar7 - uVar8 == 0) goto LAB_001042b7;
        pcStack_40 = (code *)0x103f3e;
        poVar5 = std::ostream::_M_insert<double>(*(double *)((long)&pCVar1->salePrice + lVar9));
        pcStack_40 = (code *)0x103f55;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        pcStack_40 = (code *)0x103f60;
        std::ostream::put((char)poVar5);
        pcStack_40 = (code *)0x103f68;
        std::ostream::flush();
        pcStack_40 = (code *)0x103f7c;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Date sold: ",0xb);
        pCVar1 = (cars->super__Vector_base<Car,_std::allocator<Car>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar7 = ((long)(cars->super__Vector_base<Car,_std::allocator<Car>_>)._M_impl.
                       super__Vector_impl_data._M_finish - (long)pCVar1 >> 3) * -0x1111111111111111;
        if (uVar7 < uVar8 || uVar7 - uVar8 == 0) goto LAB_001042b7;
        pcStack_40 = (code *)0x103fa4;
        poVar5 = (ostream *)
                 std::ostream::operator<<
                           ((ostream *)&std::cout,*(int *)((long)&(pCVar1->dateSold).month + lVar9))
        ;
        pcVar10 = "/";
        pcStack_40 = (code *)0x103fbe;
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"/",1);
        pCVar1 = (cars->super__Vector_base<Car,_std::allocator<Car>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar7 = ((long)(cars->super__Vector_base<Car,_std::allocator<Car>_>)._M_impl.
                       super__Vector_impl_data._M_finish - (long)pCVar1 >> 3) * -0x1111111111111111;
        if (uVar7 < uVar8 || uVar7 - uVar8 == 0) goto LAB_001042b7;
        pcStack_40 = (code *)0x103fe6;
        poVar5 = (ostream *)
                 std::ostream::operator<<(poVar5,*(int *)((long)&(pCVar1->dateSold).day + lVar9));
        pcStack_40 = (code *)0x103ff9;
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"/",1);
        pCVar1 = (cars->super__Vector_base<Car,_std::allocator<Car>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar7 = ((long)(cars->super__Vector_base<Car,_std::allocator<Car>_>)._M_impl.
                       super__Vector_impl_data._M_finish - (long)pCVar1 >> 3) * -0x1111111111111111;
        if (uVar7 < uVar8 || uVar7 - uVar8 == 0) goto LAB_001042b7;
        pcStack_40 = (code *)0x104021;
        poVar5 = (ostream *)
                 std::ostream::operator<<(poVar5,*(int *)((long)&(pCVar1->dateSold).year + lVar9));
        pcStack_40 = (code *)0x104038;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        pcStack_40 = (code *)0x104043;
        std::ostream::put((char)poVar5);
        pcStack_40 = (code *)0x10404b;
        std::ostream::flush();
        pcVar10 = (char *)&std::cout;
        pcStack_40 = (code *)0x104066;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Profit: $",9);
        lVar4 = std::cout;
        *(undefined8 *)(strtol + *(long *)(std::cout + -0x18)) = 2;
        *(uint *)(__cxa_rethrow + *(long *)(lVar4 + -0x18)) =
             *(uint *)(__cxa_rethrow + *(long *)(lVar4 + -0x18)) & 0xfffffefb | 4;
        pCVar1 = (cars->super__Vector_base<Car,_std::allocator<Car>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar7 = ((long)(cars->super__Vector_base<Car,_std::allocator<Car>_>)._M_impl.
                       super__Vector_impl_data._M_finish - (long)pCVar1 >> 3) * -0x1111111111111111;
        if (uVar7 < uVar8 || uVar7 - uVar8 == 0) goto LAB_001042b7;
        pcStack_40 = (code *)0x1040bf;
        poVar5 = std::ostream::_M_insert<double>
                           (*(double *)((long)&pCVar1->salePrice + lVar9) -
                            *(double *)((long)&pCVar1->purchasePrice + lVar9));
      }
      else {
        pcStack_40 = (code *)0x1040db;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Status: NOT SOLD",0x10);
        pcStack_40 = (code *)0x1040ef;
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
        pcStack_40 = (code *)0x1040fa;
        std::ostream::put(-0x60);
        pcStack_40 = (code *)0x104102;
        std::ostream::flush();
        pcStack_40 = (code *)0x104116;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Sale price: N/A",0xf);
        pcStack_40 = (code *)0x10412a;
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
        pcStack_40 = (code *)0x104135;
        std::ostream::put(-0x60);
        pcStack_40 = (code *)0x10413d;
        std::ostream::flush();
        pcStack_40 = (code *)0x104151;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Sale date: N/A",0xe);
        pcStack_40 = (code *)0x104165;
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
        pcStack_40 = (code *)0x104170;
        std::ostream::put(-0x60);
        pcStack_40 = (code *)0x104178;
        std::ostream::flush();
        pcStack_40 = (code *)0x10418c;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Profit: N/A",0xb);
        poVar5 = (ostream *)&std::cout;
      }
      pcStack_40 = (code *)0x1041a4;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      pcStack_40 = (code *)0x1041af;
      std::ostream::put((char)poVar5);
      pcStack_40 = (code *)0x1041b7;
      std::ostream::flush();
      pcStack_40 = (code *)0x1041cb;
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
      pcStack_40 = (code *)0x1041d6;
      std::ostream::put(-0x60);
      pcStack_40 = (code *)0x1041de;
      plVar6 = (long *)std::ostream::flush();
      pcStack_40 = (code *)0x1041f5;
      std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
      pcStack_40 = (code *)0x104200;
      std::ostream::put((char)plVar6);
      pcStack_40 = (code *)0x104208;
      std::ostream::flush();
      uVar7 = ((long)(cars->super__Vector_base<Car,_std::allocator<Car>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(cars->super__Vector_base<Car,_std::allocator<Car>_>)._M_impl.
                     super__Vector_impl_data._M_start >> 3) * -0x1111111111111111;
      lVar9 = lVar9 + 0x78;
      uVar8 = local_38;
    } while (local_38 <= uVar7 && uVar7 - local_38 != 0);
  }
  return;
}

Assistant:

void PrintInventory(vector<Car> &cars)
{

    if(cars.size() == 0)
    {
        cout << endl << "No cars in inventory!" << endl << endl;
        return;
    }

    cout << endl << endl;
    cout << "Inventory printout:";
    cout << endl << endl;

    for(int i = 0; i < cars.size(); i++)
    {
        cout << "Car " << (i + 1) << endl << endl;
        cout << "Make: " << cars.at(i).make << endl;
        cout << "Model: " << cars.at(i).model << endl;
        cout << "Year: " << cars.at(i).year << endl;
        cout << "Purchase price: $" << setprecision(2) << fixed << cars.at(i).purchasePrice << endl;
        cout << "Date purchased: " << cars.at(i).datePurchased.month << "/" << cars.at(i).datePurchased.day <<
                "/" << cars.at(i).datePurchased.year << endl;
        if(cars.at(i).isSold)
        {
            cout << "Status: SOLD" << endl;
            cout << "Sale Price: $" << setprecision(2) << fixed << cars.at(i).salePrice << endl;
            cout << "Date sold: " << cars.at(i).dateSold.month << "/" << cars.at(i).dateSold.day <<
                    "/" << cars.at(i).dateSold.year << endl;
            cout << "Profit: $" << setprecision(2) << fixed << (cars.at(i).salePrice - cars.at(i).purchasePrice) << endl;

        }
        else
        {
            cout << "Status: NOT SOLD" << endl;
            cout << "Sale price: N/A" << endl;
            cout << "Sale date: N/A" << endl;
            cout << "Profit: N/A" << endl;
        }

        cout << endl << endl;
    }
}